

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

termination_code
PDHG_Check_Dual_Infeasibility
          (CUPDLPwork *pdhg,cupdlp_float dDualInfeasObj,cupdlp_float dDualInfeasRes)

{
  termination_code tVar1;
  
  tVar1 = FEASIBLE;
  if ((dDualInfeasObj < 0.0) && (dDualInfeasRes < -pdhg->resobj->dFeasTol * dDualInfeasObj)) {
    tVar1 = INFEASIBLE;
  }
  return tVar1;
}

Assistant:

termination_code PDHG_Check_Dual_Infeasibility(CUPDLPwork *pdhg,
                                               cupdlp_float dDualInfeasObj,
                                               cupdlp_float dDualInfeasRes) {
  CUPDLPresobj *resobj = pdhg->resobj;

  termination_code dualCode = FEASIBLE;

  if (dDualInfeasObj < 0.0) {
    if (dDualInfeasRes < -resobj->dFeasTol * dDualInfeasObj)
      dualCode = INFEASIBLE;
  }

  return dualCode;
}